

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SaturationAlgorithm.cpp
# Opt level: O0

void __thiscall
Saturation::SaturationAlgorithm::onClauseReduction
          (SaturationAlgorithm *this,Clause *cl,Clause **replacements,uint numOfReplacements,
          ClauseIterator *premises,bool forward)

{
  Iterator it;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  uint in_ECX;
  long *in_RDX;
  SaturationAlgorithm *in_RSI;
  char *pcVar4;
  long in_RDI;
  VirtualIterator<Kernel::Clause_*> *in_R8;
  byte in_R9B;
  Clause *premise;
  Iterator pit;
  Clause *replacement_1;
  uint i;
  Clause *replacement;
  Clause *in_stack_00000668;
  Stack<Kernel::Clause_*> *in_stack_fffffffffffffe78;
  Options *in_stack_fffffffffffffe80;
  Clause *in_stack_fffffffffffffe88;
  SaturationAlgorithm *in_stack_fffffffffffffe90;
  ostream *in_stack_fffffffffffffeb0;
  Stack<Kernel::Clause_*> *in_stack_fffffffffffffeb8;
  Clause *in_stack_fffffffffffffed8;
  ostream *in_stack_fffffffffffffee0;
  Clause *pCVar5;
  ClauseStack *this_00;
  string local_d8 [32];
  Clause *local_b8;
  RefIterator local_b0;
  string local_a0 [32];
  long local_80;
  uint local_74;
  undefined1 local_70 [96];
  SaturationAlgorithm *local_10;
  
  local_70[0x47] = in_R9B & 1;
  local_70._84_4_ = in_ECX;
  local_70._88_8_ = in_RDX;
  local_10 = in_RSI;
  if ((onClauseReduction(Kernel::Clause*,Kernel::Clause**,unsigned_int,Lib::VirtualIterator<Kernel::Clause*>,bool)
       ::premStack == '\0') &&
     (iVar2 = __cxa_guard_acquire(&onClauseReduction(Kernel::Clause*,Kernel::Clause**,unsigned_int,Lib::VirtualIterator<Kernel::Clause*>,bool)
                                   ::premStack), iVar2 != 0)) {
    Lib::Stack<Kernel::Clause_*>::Stack
              ((Stack<Kernel::Clause_*> *)in_stack_fffffffffffffe90,
               (size_t)in_stack_fffffffffffffe88);
    __cxa_atexit(Lib::Stack<Kernel::Clause_*>::~Stack,&onClauseReduction::premStack,&__dso_handle);
    __cxa_guard_release(&onClauseReduction(Kernel::Clause*,Kernel::Clause**,unsigned_int,Lib::VirtualIterator<Kernel::Clause*>,bool)
                         ::premStack);
  }
  this_00 = &onClauseReduction::premStack;
  Lib::Stack<Kernel::Clause_*>::reset(&onClauseReduction::premStack);
  Lib::VirtualIterator<Kernel::Clause_*>::VirtualIterator
            ((VirtualIterator<Kernel::Clause_*> *)(local_70 + 0x28),in_R8);
  Lib::Stack<Kernel::Clause*>::loadFromIterator<Lib::VirtualIterator<Kernel::Clause*>>
            ((Stack<Kernel::Clause_*> *)in_stack_fffffffffffffe90,
             (VirtualIterator<Kernel::Clause_*> *)in_stack_fffffffffffffe88);
  Lib::VirtualIterator<Kernel::Clause_*>::~VirtualIterator
            ((VirtualIterator<Kernel::Clause_*> *)in_stack_fffffffffffffe80);
  if (local_70._84_4_ == 0) {
    pCVar5 = (Clause *)0x0;
  }
  else {
    pCVar5 = *(Clause **)local_70._88_8_;
  }
  local_70._32_8_ = pCVar5;
  bVar1 = Shell::Options::showReductions(in_stack_fffffffffffffe80);
  if (bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cout,"[SA] ");
    pcVar4 = "backward";
    if ((local_70[0x47] & 1) != 0) {
      pcVar4 = "forward";
    }
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3," reduce: ");
    in_stack_fffffffffffffed8 = (Clause *)local_70;
    Kernel::Clause::toString_abi_cxx11_(in_stack_00000668);
    in_stack_fffffffffffffee0 = std::operator<<(poVar3,(string *)in_stack_fffffffffffffed8);
    std::ostream::operator<<(in_stack_fffffffffffffee0,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)local_70);
    for (local_74 = 0; local_74 < (uint)local_70._84_4_; local_74 = local_74 + 1) {
      local_80 = *(long *)local_70._88_8_;
      if (local_80 != 0) {
        in_stack_fffffffffffffeb8 =
             (Stack<Kernel::Clause_*> *)std::operator<<((ostream *)&std::cout,"      replaced by ");
        Kernel::Clause::toString_abi_cxx11_(in_stack_00000668);
        poVar3 = std::operator<<((ostream *)in_stack_fffffffffffffeb8,local_a0);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_a0);
      }
      local_70._88_8_ = local_70._88_8_ + 8;
    }
    Lib::Stack<Kernel::Clause_*>::Iterator::Iterator
              ((Iterator *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    while (bVar1 = Lib::Stack<Kernel::Clause_*>::RefIterator::hasNext(&local_b0), bVar1) {
      local_b8 = Lib::Stack<Kernel::Clause_*>::Iterator::next((Iterator *)0xacfd8e);
      if (local_b8 != (Clause *)0x0) {
        poVar3 = std::operator<<((ostream *)&std::cout,"     using ");
        Kernel::Clause::toString_abi_cxx11_(in_stack_00000668);
        in_stack_fffffffffffffeb0 = std::operator<<(poVar3,local_d8);
        std::ostream::operator<<(in_stack_fffffffffffffeb0,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_d8);
      }
    }
  }
  if (*(long *)(in_RDI + 0xd0) != 0) {
    in_stack_fffffffffffffe88 = *(Clause **)(in_RDI + 0xd0);
    Lib::Stack<Kernel::Clause_*>::Iterator::Iterator
              ((Iterator *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    it.super_RefIterator._stack = in_stack_fffffffffffffeb8;
    it.super_RefIterator._pointer = (Clause **)in_stack_fffffffffffffeb0;
    Lib::pvi<Lib::Stack<Kernel::Clause*>::Iterator>(it);
    Splitter::onClauseReduction
              ((Splitter *)this_00,pCVar5,(ClauseIterator *)in_stack_fffffffffffffee0,
               in_stack_fffffffffffffed8);
    Lib::VirtualIterator<Kernel::Clause_*>::~VirtualIterator
              ((VirtualIterator<Kernel::Clause_*> *)in_stack_fffffffffffffe80);
    in_stack_fffffffffffffe90 = local_10;
  }
  if ((Clause *)local_70._32_8_ != (Clause *)0x0) {
    onParenthood(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                 (Clause *)in_stack_fffffffffffffe80);
    while (bVar1 = Lib::Stack<Kernel::Clause_*>::isNonEmpty(&onClauseReduction::premStack), bVar1) {
      pCVar5 = (Clause *)local_70._32_8_;
      Lib::Stack<Kernel::Clause_*>::pop(&onClauseReduction::premStack);
      onParenthood(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,pCVar5);
    }
  }
  return;
}

Assistant:

void SaturationAlgorithm::onClauseReduction(Clause* cl, Clause **replacements, unsigned numOfReplacements,
                                            ClauseIterator premises, bool forward)
{
  ASS(cl);

  static ClauseStack premStack;
  premStack.reset();
  premStack.loadFromIterator(premises);

  Clause *replacement = numOfReplacements ? *replacements : 0;

  if (env.options->showReductions()) {
    std::cout << "[SA] " << (forward ? "forward" : "backward") << " reduce: " << cl->toString() << endl;
    for(unsigned i = 0; i < numOfReplacements; i++){
      Clause* replacement = *replacements;
      if(replacement){ std::cout << "      replaced by " << replacement->toString() << endl; }
      replacements++;
    }
    ClauseStack::Iterator pit(premStack);
    while(pit.hasNext()){
      Clause* premise = pit.next();
      if(premise){ std::cout << "     using " << premise->toString() << endl; }
    }
  }

  if (_splitter) {
    _splitter->onClauseReduction(cl, pvi(ClauseStack::Iterator(premStack)), replacement);
  }

  if (replacement) {
    // Where an inference has multiple conclusions, onParenthood will only be run
    // for the final conclusion. This is unsafe when running with symbol elimination.
    // At the moment the only simplification rules that have multiple conclusions
    // are higher-order and it is assumed that we will not run higher-order along
    // with symbol elimination.
    // In the future if a first-order simplification rule is added with multiple
    // conclusions, this code should be updated.
    onParenthood(replacement, cl);
    while (premStack.isNonEmpty()) {
      onParenthood(replacement, premStack.pop());
    }
  }
}